

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O3

int I210ToAR30Matrix(uint16_t *src_y,int src_stride_y,uint16_t *src_u,int src_stride_u,
                    uint16_t *src_v,int src_stride_v,uint8_t *dst_ar30,int dst_stride_ar30,
                    YuvConstants *yuvconstants,int width,int height)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  code *pcVar4;
  code *pcVar5;
  undefined1 auVar6 [16];
  
  auVar6._0_4_ = -(uint)(src_y == (uint16_t *)0x0);
  auVar6._4_4_ = -(uint)(src_u == (uint16_t *)0x0);
  auVar6._8_4_ = -(uint)(src_v == (uint16_t *)0x0);
  auVar6._12_4_ = -(uint)(dst_ar30 == (uint8_t *)0x0);
  iVar3 = movmskps((int)src_u,auVar6);
  iVar1 = -1;
  if ((height != 0 && 0 < width) && iVar3 == 0) {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      dst_ar30 = dst_ar30 + ~height * dst_stride_ar30;
      dst_stride_ar30 = -dst_stride_ar30;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 7U) == 0) {
      pcVar5 = I210ToAR30Row_SSSE3;
    }
    else {
      pcVar5 = I210ToAR30Row_Any_SSSE3;
    }
    if ((uVar2 & 0x40) == 0) {
      pcVar5 = I210ToAR30Row_C;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 0xfU) == 0) {
      pcVar4 = I210ToAR30Row_AVX2;
    }
    else {
      pcVar4 = I210ToAR30Row_Any_AVX2;
    }
    if ((uVar2 >> 10 & 1) == 0) {
      pcVar4 = pcVar5;
    }
    do {
      (*pcVar4)(src_y,src_u,src_v,dst_ar30,yuvconstants,width);
      dst_ar30 = dst_ar30 + dst_stride_ar30;
      src_y = src_y + src_stride_y;
      src_u = src_u + src_stride_u;
      src_v = src_v + src_stride_v;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I210ToAR30Matrix(const uint16_t* src_y,
                     int src_stride_y,
                     const uint16_t* src_u,
                     int src_stride_u,
                     const uint16_t* src_v,
                     int src_stride_v,
                     uint8_t* dst_ar30,
                     int dst_stride_ar30,
                     const struct YuvConstants* yuvconstants,
                     int width,
                     int height) {
  int y;
  void (*I210ToAR30Row)(const uint16_t* y_buf, const uint16_t* u_buf,
                        const uint16_t* v_buf, uint8_t* rgb_buf,
                        const struct YuvConstants* yuvconstants, int width) =
      I210ToAR30Row_C;
  if (!src_y || !src_u || !src_v || !dst_ar30 || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_ar30 = dst_ar30 + (height - 1) * dst_stride_ar30;
    dst_stride_ar30 = -dst_stride_ar30;
  }
#if defined(HAS_I210TOAR30ROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    I210ToAR30Row = I210ToAR30Row_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      I210ToAR30Row = I210ToAR30Row_SSSE3;
    }
  }
#endif
#if defined(HAS_I210TOAR30ROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    I210ToAR30Row = I210ToAR30Row_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      I210ToAR30Row = I210ToAR30Row_AVX2;
    }
  }
#endif
  for (y = 0; y < height; ++y) {
    I210ToAR30Row(src_y, src_u, src_v, dst_ar30, yuvconstants, width);
    dst_ar30 += dst_stride_ar30;
    src_y += src_stride_y;
    src_u += src_stride_u;
    src_v += src_stride_v;
  }
  return 0;
}